

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_pred_impl.h
# Opt level: O0

AssertionResult __thiscall
testing::AssertPred2Helper<bool(*)(char_const*,char_const*),char_const*,char[12]>
          (testing *this,char *pred_text,char *e1,char *e2,_func_bool_char_ptr_char_ptr *pred,
          char **v1,char (*v2) [12])

{
  bool bVar1;
  AssertionResult *pAVar2;
  char **value;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar4;
  string local_98;
  string local_78;
  AssertionResult local_48;
  testing *local_38;
  char **v1_local;
  _func_bool_char_ptr_char_ptr *pred_local;
  char *e2_local;
  char *e1_local;
  char *pred_text_local;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var3;
  
  local_38 = (testing *)v1;
  v1_local = (char **)pred;
  pred_local = (_func_bool_char_ptr_char_ptr *)e2;
  e2_local = e1;
  e1_local = pred_text;
  pred_text_local = (char *)this;
  bVar1 = (*pred)(*v1,*v2);
  if (bVar1) {
    AVar4 = AssertionSuccess();
    _Var3._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )AVar4.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  }
  else {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_48,&e1_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x89bcad);
    pAVar2 = AssertionResult::operator<<(pAVar2,&e2_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x89bb44);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&pred_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [28])") evaluates to false, where");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x89ef79);
    pAVar2 = AssertionResult::operator<<(pAVar2,&e2_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [15])" evaluates to ");
    PrintToString<char_const*>(&local_78,local_38,value);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_78);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x89ef79);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&pred_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [15])" evaluates to ");
    PrintToString<char[12]>(&local_98,v2);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_98);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    AssertionResult::~AssertionResult(&local_48);
    _Var3._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         extraout_RDX._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var3._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult AssertPred2Helper(const char* pred_text, const char* e1,
                                  const char* e2, Pred pred, const T1& v1,
                                  const T2& v2) {
  if (pred(v1, v2)) return AssertionSuccess();

  return AssertionFailure()
         << pred_text << "(" << e1 << ", " << e2
         << ") evaluates to false, where"
         << "\n"
         << e1 << " evaluates to " << ::testing::PrintToString(v1) << "\n"
         << e2 << " evaluates to " << ::testing::PrintToString(v2);
}